

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

FunctionBody * TTD::JsSupport::ForceAndGetFunctionBody(ParseableFunctionInfo *pfi)

{
  BOOL BVar1;
  DeferDeserializeFunctionInfo *this;
  ParseableFunctionInfo *this_00;
  DeferDeserializeFunctionInfo *deferDeserializeInfo;
  FunctionBody *fb;
  ParseableFunctionInfo *pfi_local;
  
  BVar1 = Js::FunctionProxy::IsDeferredDeserializeFunction(&pfi->super_FunctionProxy);
  if (BVar1 == 0) {
    BVar1 = Js::FunctionProxy::IsDeferredParseFunction(&pfi->super_FunctionProxy);
    if (BVar1 == 0) {
      deferDeserializeInfo =
           (DeferDeserializeFunctionInfo *)
           Js::FunctionProxy::GetFunctionBody(&pfi->super_FunctionProxy);
    }
    else {
      this_00 = Js::FunctionProxy::GetParseableFunctionInfo(&pfi->super_FunctionProxy);
      deferDeserializeInfo =
           (DeferDeserializeFunctionInfo *)
           Js::ParseableFunctionInfo::Parse(this_00,(ScriptFunction **)0x0,false);
    }
  }
  else {
    this = Js::FunctionProxy::GetDeferDeserializeFunctionInfo(&pfi->super_FunctionProxy);
    deferDeserializeInfo =
         (DeferDeserializeFunctionInfo *)Js::DeferDeserializeFunctionInfo::Deserialize(this);
  }
  if (deferDeserializeInfo != (DeferDeserializeFunctionInfo *)0x0) {
    Js::FunctionProxy::EnsureDeserialized(&deferDeserializeInfo->super_FunctionProxy);
    return (FunctionBody *)deferDeserializeInfo;
  }
  TTDAbort_unrecoverable_error("I just want a function body!!!");
}

Assistant:

Js::FunctionBody* ForceAndGetFunctionBody(Js::ParseableFunctionInfo* pfi)
        {
            Js::FunctionBody* fb = nullptr;

            if(pfi->IsDeferredDeserializeFunction())
            {
                Js::DeferDeserializeFunctionInfo* deferDeserializeInfo = pfi->GetDeferDeserializeFunctionInfo();
                fb = deferDeserializeInfo->Deserialize();
            }
            else
            {
                if(pfi->IsDeferredParseFunction())
                {
                    fb = pfi->GetParseableFunctionInfo()->Parse();
                }
                else
                {
                    fb = pfi->GetFunctionBody();
                }
            }
            TTDAssert(fb != nullptr, "I just want a function body!!!");

            fb->EnsureDeserialized();
            return fb;
        }